

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drandmea.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *__ptr;
  int iVar5;
  double dVar6;
  double dVar7;
  size_t sStack_70;
  double local_68;
  double local_60;
  double local_48;
  undefined8 local_40;
  
  if (argc - 7U < 0xfffffffe) {
    fwrite("Usage: drandmea Length HalfPeriod MinAmpl MaxAmpl\n   or  drandmea Length MinHalfPer MaxHalfPer MinAmpl MaxAmpl\nDRAND_SAFE=something to avoid the same seed in srand()\n"
           ,0xa6,1,_stderr);
    iVar1 = 1;
  }
  else {
    iVar1 = atoi(argv[1]);
    if (iVar1 < 1) {
      __ptr = "Length must be positive\n";
      sStack_70 = 0x18;
    }
    else {
      iVar2 = atoi(argv[2]);
      if (argc == 5) {
        if (0 < iVar2) {
          local_60 = atof(argv[3]);
          local_68 = atof(argv[4]);
          dVar6 = 0.0;
          local_48 = 0.0;
LAB_00101251:
          reset_rand();
          local_40 = rand_unified(local_60,local_68);
          iVar4 = 0;
          iVar3 = 0;
          if (argc != 6) goto LAB_001012ac;
          do {
            dVar7 = (double)rand_unified(local_48,dVar6);
            iVar2 = 1;
            iVar3 = iVar4;
            if (1 < (int)dVar7) {
              iVar2 = (int)dVar7;
            }
LAB_001012ac:
            if (iVar2 < 1) {
              iVar2 = 0;
            }
            do {
              iVar4 = iVar3 + iVar2;
              iVar5 = 0;
              while( true ) {
                if (iVar1 <= iVar3 + iVar5) {
                  return 0;
                }
                if (iVar2 == iVar5) break;
                printf("%g\n",local_40);
                iVar5 = iVar5 + 1;
              }
              local_40 = rand_unified(local_60,local_68);
              iVar3 = iVar4;
            } while (argc != 6);
          } while( true );
        }
        __ptr = "HalfPeriod must be positive\n";
        sStack_70 = 0x1c;
      }
      else {
        iVar3 = atoi(argv[3]);
        if ((0 < iVar2) && (0 < iVar3)) {
          local_60 = atof(argv[4]);
          local_68 = atof(argv[5]);
          local_48 = (double)iVar2;
          dVar6 = (double)(iVar3 + 1);
          goto LAB_00101251;
        }
        __ptr = "MinHalfPer and nMaxHalfPer must be positive\n";
        sStack_70 = 0x2c;
      }
    }
    fwrite(__ptr,sStack_70,1,_stderr);
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc != 5 && argc != 6)
    {
      fprintf(stderr,
	      "Usage: drandmea Length HalfPeriod MinAmpl MaxAmpl\n"\
	      "   or  drandmea Length MinHalfPer MaxHalfPer MinAmpl MaxAmpl\n"\
	      "DRAND_SAFE=something to avoid the same seed in srand()\n");
      return 1;
    }

  double	fMinAmpl, fMaxAmpl;
  int		nLength, nHalfPeriod, nMinHalfPer, nMaxHalfPer;

  nLength = atoi(argv[1]);
  if(nLength <= 0)
    {
      fprintf(stderr, "Length must be positive\n");
      return 2;
    }

  if(argc == 5)
    {
      nHalfPeriod = atoi(argv[2]);
      if(nHalfPeriod <= 0)
	{
	  fprintf(stderr, "HalfPeriod must be positive\n");
	  return 2;
	}
      fMinAmpl = atof(argv[3]);
      fMaxAmpl = atof(argv[4]);
    }
  else
    {
      nMinHalfPer = atoi(argv[2]);
      nMaxHalfPer = atoi(argv[3]);
      if(nMinHalfPer <= 0 || nMaxHalfPer <= 0)
	{
	  fprintf(stderr, "MinHalfPer and nMaxHalfPer must be positive\n");
	  return 2;
	}
      fMinAmpl = atof(argv[4]);
      fMaxAmpl = atof(argv[5]);
    }

  // See DRAND_SAFE to prevent dependent random series
  reset_rand();

  NaReal	fAmpl = rand_unified(fMinAmpl, fMaxAmpl);
  if(argc == 6)
    {
      nHalfPeriod = rand_unified(nMinHalfPer, nMaxHalfPer + 1);
      if(nHalfPeriod <= 0)
	nHalfPeriod = 1;
    }

  int		i = 0, j = 0;
  while(i < nLength)
    {
      if(j < nHalfPeriod)
	{
	  printf("%g\n", fAmpl);
	  ++j;
	}
      else
	{
	  fAmpl = rand_unified(fMinAmpl, fMaxAmpl);
	  if(argc == 6)
	    {
	      nHalfPeriod = rand_unified(nMinHalfPer, nMaxHalfPer + 1);
	      if(nHalfPeriod <= 0)
		nHalfPeriod = 1;
	    }
	  j = 0;
	  continue;
	}
      ++i;
    }

  return 0;
}